

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::LowerGeneratorHelper::LowerGeneratorResumeJumpTable
          (LowerGeneratorHelper *this,Instr *jumpTableInstr)

{
  code *pcVar1;
  anon_class_32_4_d3f9a993 fn;
  bool bVar2;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar3;
  Opnd *local_28;
  Opnd *srcOpnd;
  LabelInstr *bailOutForElidedYield;
  Instr *jumpTableInstr_local;
  LowerGeneratorHelper *this_local;
  
  bailOutForElidedYield = (LabelInstr *)jumpTableInstr;
  jumpTableInstr_local = (Instr *)this;
  this_00 = Func::GetJITFunctionBody(this->func);
  bVar2 = JITTimeFunctionBody::IsCoroutine(this_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x724c,"(this->func->GetJITFunctionBody()->IsCoroutine())",
                       "this->func->GetJITFunctionBody()->IsCoroutine()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((bailOutForElidedYield->super_Instr).m_opcode != GeneratorResumeJumpTable) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x724d,"(jumpTableInstr->m_opcode == Js::OpCode::GeneratorResumeJumpTable)",
                       "jumpTableInstr->m_opcode == Js::OpCode::GeneratorResumeJumpTable");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  srcOpnd = (Opnd *)InsertBailOutForElidedYield(this);
  local_28 = IR::Instr::UnlinkSrc1(&bailOutForElidedYield->super_Instr);
  fn.srcOpnd = &local_28;
  fn.this = this;
  fn.jumpTableInstr = (Instr **)&bailOutForElidedYield;
  fn.bailOutForElidedYield = (LabelInstr **)&srcOpnd;
  Func::
  MapYieldOffsetResumeLabels<Lowerer::LowerGeneratorHelper::LowerGeneratorResumeJumpTable(IR::Instr*)::__0>
            (this->func,fn);
  IR::Instr::Remove(&bailOutForElidedYield->super_Instr);
  return;
}

Assistant:

void
Lowerer::LowerGeneratorHelper::LowerGeneratorResumeJumpTable(IR::Instr* jumpTableInstr)
{
    Assert(this->func->GetJITFunctionBody()->IsCoroutine());
    Assert(jumpTableInstr->m_opcode == Js::OpCode::GeneratorResumeJumpTable);

    IR::LabelInstr* bailOutForElidedYield = this->InsertBailOutForElidedYield();

    IR::Opnd* srcOpnd = jumpTableInstr->UnlinkSrc1();

    this->func->MapYieldOffsetResumeLabels([this, &srcOpnd, &jumpTableInstr, &bailOutForElidedYield](int i, const YieldOffsetResumeLabel& yorl)
    {
        uint32 offset = yorl.First();
        IR::LabelInstr* resumeLabel = yorl.Second();

        if (resumeLabel != nullptr)
        {
            Assert(resumeLabel->IsGeneratorBailInInstr());
            // Also fix up the bailout at the label with the jump to epilog that was not emitted in GenerateBailOut()
            this->lowerer->GenerateJumpToEpilogForBailOut(resumeLabel->m_prev->GetBailOutInfo(), resumeLabel->m_prev, this->GetEpilogueForBailOut());
        }
        else if (resumeLabel == nullptr)
        {
            resumeLabel = bailOutForElidedYield;
        }

        // For each offset label pair, insert a compare of the offset and branch if equal to the label
        this->lowerer->InsertCompareBranch(srcOpnd, IR::IntConstOpnd::New(offset, TyUint32, this->func), Js::OpCode::BrSrEq_A, resumeLabel, jumpTableInstr);
    });

    jumpTableInstr->Remove();
}